

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::TermPass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,int depth)

{
  EncodedChar *location;
  code *pcVar1;
  EncodedChar EVar2;
  bool bVar3;
  byte bVar4;
  Char CVar5;
  uint uVar6;
  CharCount CVar7;
  CharCount CVar8;
  ThreadContext *this_00;
  ScriptConfiguration *this_01;
  undefined4 *puVar9;
  bool bVar10;
  CharCount upper;
  CharCount lower;
  Char c;
  EncodedChar *current;
  bool clearLocationIfPresent;
  int depth_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  this_00 = Js::ScriptContext::GetThreadContext(this->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,this->scriptContext,(PVOID)0x0);
  bVar10 = this->tempLocationOfSurrogatePair != (EncodedChar *)0x0;
  EVar2 = ECLookahead(this,0);
  switch(EVar2) {
  case '\0':
    bVar3 = IsEOF(this);
    if (bVar3) {
      Fail(this,-0x7ff5ec67);
    }
  default:
    location = this->next;
    CVar5 = NextChar(this);
    this_01 = Js::ScriptContext::GetConfig(this->scriptContext);
    bVar3 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_01);
    if (bVar3) {
      TrackIfSurrogatePair(this,(uint)(ushort)CVar5,location,(int)this->next - (int)location);
    }
    break;
  case '$':
  case '^':
    ECConsume(this,1);
    return;
  case '(':
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
    bVar10 = false;
    ECConsume(this,1);
    EVar2 = ECLookahead(this,0);
    if (EVar2 == '?') {
      bVar3 = ECCanConsume(this,2);
      if (!bVar3) {
        Fail(this,-0x7ff5ec67);
      }
      EVar2 = ECLookahead(this,1);
      if (((EVar2 == '!') || (EVar2 == ':')) || (EVar2 == '=')) {
        ECConsume(this,2);
      }
      else {
        this->numGroups = this->numGroups + 1;
      }
    }
    else {
      this->numGroups = this->numGroups + 1;
    }
    DisjunctionPass0(this,depth + 1);
    ECMust(this,')',-0x7ff5ec64);
    break;
  case ')':
  case '|':
    Fail(this,-0x7ff5ec67);
    break;
  case '*':
  case '+':
  case '?':
  case '{':
    bVar3 = AtQuantifier(this);
    if (bVar3) {
      Fail(this,-0x7ff5ec66);
    }
    else {
      ECConsume(this,1);
    }
    break;
  case '.':
    ECConsume(this,1);
    break;
  case '[':
    ECConsume(this,1);
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
    this->tempLocationOfRange = this->next;
    CharacterClassPass0(this);
    this->tempLocationOfRange = (EncodedChar *)0x0;
    ECMust(this,']',-0x7ff5ec65);
    break;
  case '\\':
    ECConsume(this,1);
    bVar3 = AtomEscapePass0(this);
    if (bVar3) {
      return;
    }
    break;
  case ']':
  case '}':
    NextChar(this);
  }
  if ((bVar10) && (this->tempLocationOfSurrogatePair != (EncodedChar *)0x0)) {
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
  }
  bVar10 = AtQuantifier(this);
  if (bVar10) {
    bVar4 = ECLookahead(this,0);
    uVar6 = (uint)bVar4;
    if ((uVar6 - 0x2a < 2) || (uVar6 == 0x3f)) {
      ECConsume(this,1);
      OptNonGreedy(this);
    }
    else if (uVar6 == 0x7b) {
      ECConsume(this,1);
      CVar7 = RepeatCount(this);
      EVar2 = ECLookahead(this,0);
      if (EVar2 == ',') {
        ECConsume(this,1);
        EVar2 = ECLookahead(this,0);
        if (EVar2 == '}') {
          ECConsume(this,1);
          OptNonGreedy(this);
        }
        else {
          CVar8 = RepeatCount(this);
          if (CVar8 < CVar7) {
            Fail(this,-0x7ff5ec67);
          }
          EVar2 = ECLookahead(this,0);
          if (EVar2 != '}') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0x50e,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
            if (!bVar10) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          ECConsume(this,1);
          OptNonGreedy(this);
        }
      }
      else if (EVar2 == '}') {
        ECConsume(this,1);
        OptNonGreedy(this);
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                            ,0x518,"(false)","false");
        if (!bVar10) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0x51e,"(false)","false");
      if (!bVar10) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::TermPass0(int depth)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);
        // Either we have a location at the start, or the end, never both. As in between it should have been cleared if surrogate pair
        // Or must be cleared if we didn't perform the check
        bool clearLocationIfPresent = this->tempLocationOfSurrogatePair != nullptr;

        switch (ECLookahead())
        {
        case '^':
        case '$':
            ECConsume();
            return;
        case '\\':
            ECConsume();
            if (AtomEscapePass0())
                return;
            break;
        case '(':
            // Can't combine into a single codeunit because of group present
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            clearLocationIfPresent = false;
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                if (!ECCanConsume(2))
                    Fail(JSERR_RegExpSyntax);
                switch (ECLookahead(1))
                {
                case '=':
                case '!':
                case ':':
                    ECConsume(2);
                    break;
                default:
                    numGroups++;
                    break;
                }
                break;
            default:
                numGroups++;
                break;
            }
            DisjunctionPass0(depth + 1);
            ECMust(')', JSERR_RegExpNoParen);
            break;
        case '.':
            ECConsume();
            break;
        case '[':
            ECConsume();
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            this->tempLocationOfRange = next;
            CharacterClassPass0();
            this->tempLocationOfRange = nullptr;
            ECMust(']', JSERR_RegExpNoBracket);
            break;
        case ')':
        case '|':
            Fail(JSERR_RegExpSyntax);
            break;
        case ']':
        case '}':
            NextChar();
            break;
        case '*':
        case '+':
        case '?':
        case '{':
            if (AtQuantifier())
                Fail(JSERR_RegExpBadQuant);
            else
                ECConsume();
            break;
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            {
                const EncodedChar* current = next;
                Char c = NextChar();
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(c, current, (uint32)(next - current));
                }
                // Closing '/' in literals should be caught explicitly
                Assert(!IsLiteral || c != '/');
            }
            break;
        }

        if (clearLocationIfPresent && this->tempLocationOfSurrogatePair != nullptr)
        {
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
        }

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
            case '+':
            case '?':
                ECConsume();
                OptNonGreedy();
                break;
            case '{':
                {
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            OptNonGreedy();
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            if (upper < lower)
                                Fail(JSERR_RegExpSyntax);
                            Assert(ECLookahead() == '}');
                            ECConsume();
                            OptNonGreedy();
                        }
                        break;
                    case '}':
                        ECConsume();
                        OptNonGreedy();
                        break;
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }
    }